

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O3

void av1_loop_filter_dealloc(AV1LfSync *lf_sync)

{
  pthread_mutex_t *memblk;
  pthread_cond_t *memblk_00;
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (lf_sync != (AV1LfSync *)0x0) {
    lVar2 = 0;
    do {
      memblk = lf_sync->mutex_[lVar2];
      if (memblk != (pthread_mutex_t *)0x0) {
        if (0 < lf_sync->rows) {
          lVar3 = 0;
          lVar1 = 0;
          do {
            pthread_mutex_destroy((pthread_mutex_t *)((long)lf_sync->mutex_[lVar2] + lVar3));
            lVar1 = lVar1 + 1;
            lVar3 = lVar3 + 0x28;
          } while (lVar1 < lf_sync->rows);
          memblk = lf_sync->mutex_[lVar2];
        }
        aom_free(memblk);
      }
      memblk_00 = lf_sync->cond_[lVar2];
      if (memblk_00 != (pthread_cond_t *)0x0) {
        if (0 < lf_sync->rows) {
          lVar3 = 0;
          lVar1 = 0;
          do {
            pthread_cond_destroy((pthread_cond_t *)((long)lf_sync->cond_[lVar2] + lVar3));
            lVar1 = lVar1 + 1;
            lVar3 = lVar3 + 0x30;
          } while (lVar1 < lf_sync->rows);
          memblk_00 = lf_sync->cond_[lVar2];
        }
        aom_free(memblk_00);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    if (lf_sync->job_mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)lf_sync->job_mutex);
      aom_free(lf_sync->job_mutex);
    }
    aom_free(lf_sync->lfdata);
    lVar2 = 6;
    do {
      aom_free(lf_sync->mutex_[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 9);
    aom_free(lf_sync->job_queue);
    lf_sync->jobs_enqueued = 0;
    lf_sync->jobs_dequeued = 0;
    *(undefined8 *)&lf_sync->lf_mt_exit = 0;
    lf_sync->job_mutex = (pthread_mutex_t *)0x0;
    lf_sync->job_queue = (AV1LfMTInfo *)0x0;
    lf_sync->lfdata = (LFWorkerData *)0x0;
    *(undefined8 *)&lf_sync->num_workers = 0;
    lf_sync->cur_sb_col[2] = (int *)0x0;
    lf_sync->sync_range = 0;
    lf_sync->rows = 0;
    lf_sync->cur_sb_col[0] = (int *)0x0;
    lf_sync->cur_sb_col[1] = (int *)0x0;
    lf_sync->cond_[1] = (pthread_cond_t *)0x0;
    lf_sync->cond_[2] = (pthread_cond_t *)0x0;
    lf_sync->mutex_[2] = (pthread_mutex_t *)0x0;
    lf_sync->cond_[0] = (pthread_cond_t *)0x0;
    lf_sync->mutex_[0] = (pthread_mutex_t *)0x0;
    lf_sync->mutex_[1] = (pthread_mutex_t *)0x0;
  }
  return;
}

Assistant:

void av1_loop_filter_dealloc(AV1LfSync *lf_sync) {
  if (lf_sync != NULL) {
    int j;
#if CONFIG_MULTITHREAD
    int i;
    for (j = 0; j < MAX_MB_PLANE; j++) {
      if (lf_sync->mutex_[j] != NULL) {
        for (i = 0; i < lf_sync->rows; ++i) {
          pthread_mutex_destroy(&lf_sync->mutex_[j][i]);
        }
        aom_free(lf_sync->mutex_[j]);
      }
      if (lf_sync->cond_[j] != NULL) {
        for (i = 0; i < lf_sync->rows; ++i) {
          pthread_cond_destroy(&lf_sync->cond_[j][i]);
        }
        aom_free(lf_sync->cond_[j]);
      }
    }
    if (lf_sync->job_mutex != NULL) {
      pthread_mutex_destroy(lf_sync->job_mutex);
      aom_free(lf_sync->job_mutex);
    }
#endif  // CONFIG_MULTITHREAD
    aom_free(lf_sync->lfdata);
    for (j = 0; j < MAX_MB_PLANE; j++) {
      aom_free(lf_sync->cur_sb_col[j]);
    }

    aom_free(lf_sync->job_queue);
    // clear the structure as the source of this call may be a resize in which
    // case this call will be followed by an _alloc() which may fail.
    av1_zero(*lf_sync);
  }
}